

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

SPIRType * __thiscall spirv_cross::Variant::get<spirv_cross::SPIRType>(Variant *this)

{
  CompilerError *pCVar1;
  allocator local_69;
  string local_68 [35];
  undefined1 local_45;
  allocator local_31;
  string local_30 [32];
  Variant *local_10;
  Variant *this_local;
  
  local_10 = this;
  if (this->holder == (IVariant *)0x0) {
    local_45 = 1;
    pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_30,"nullptr",&local_31);
    CompilerError::CompilerError(pCVar1,(string *)local_30);
    local_45 = 0;
    __cxa_throw(pCVar1,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  if (this->type != TypeType) {
    pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_68,"Bad cast",&local_69);
    CompilerError::CompilerError(pCVar1,(string *)local_68);
    __cxa_throw(pCVar1,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  return (SPIRType *)this->holder;
}

Assistant:

T &get()
	{
		if (!holder)
			SPIRV_CROSS_THROW("nullptr");
		if (static_cast<Types>(T::type) != type)
			SPIRV_CROSS_THROW("Bad cast");
		return *static_cast<T *>(holder);
	}